

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::postscriptFunc(GrpParser *this)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp124_AST;
  RefAST tmp123_AST;
  RefAST tmp122_AST;
  RefAST tmp121_AST;
  RefAST tmp120_AST;
  RefAST tmp119_AST;
  RefAST postscriptFunc_AST;
  ASTPair currentAST;
  RefCount<AST> *in_stack_fffffffffffffea0;
  ASTPair *pAVar4;
  RefCount<AST> *in_stack_fffffffffffffea8;
  ASTPair *in_stack_fffffffffffffeb0;
  RefCount<AST> *in_stack_fffffffffffffeb8;
  RefCount<AST> *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  ASTFactory *in_stack_fffffffffffffed8;
  ASTFactory *this_00;
  Parser *in_stack_fffffffffffffee0;
  Parser *this_01;
  ASTFactory *this_02;
  RefToken *in_stack_ffffffffffffff18;
  NoViableAltException *in_stack_ffffffffffffff20;
  undefined1 local_c8 [31];
  undefined1 local_a9;
  undefined1 local_a8 [8];
  undefined1 local_a0 [32];
  undefined1 local_80 [24];
  undefined1 local_68 [32];
  undefined1 local_48 [72];
  
  RefCount<AST>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  ASTPair::ASTPair(in_stack_fffffffffffffeb0);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffed8,
                     (RefToken *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  RefCount<AST>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  RefCount<AST>::~RefCount(in_stack_fffffffffffffea0);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffeb0);
  this_02 = (ASTFactory *)(in_RDI + 6);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  ASTFactory::makeASTRoot
            ((ASTFactory *)in_stack_fffffffffffffee0,(ASTPair *)in_stack_fffffffffffffed8,
             (RefAST *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  RefCount<AST>::~RefCount(in_stack_fffffffffffffea0);
  Parser::match(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  pAVar4 = (ASTPair *)(in_RDI + 6);
  (**(code **)(*in_RDI + 0x28))(local_68,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffed8,
                     (RefToken *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  RefCount<AST>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  RefCount<AST>::~RefCount(in_stack_fffffffffffffea0);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffeb0);
  Parser::match(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  this_01 = (Parser *)(in_RDI + 6);
  (**(code **)(*in_RDI + 0x28))(local_80,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffed8,
                     (RefToken *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  RefCount<AST>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  RefCount<AST>::~RefCount(in_stack_fffffffffffffea0);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffeb0);
  this_00 = (ASTFactory *)(in_RDI + 6);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  ASTFactory::addASTChild(this_02,pAVar4,(RefAST *)this_01);
  RefCount<AST>::~RefCount(in_stack_fffffffffffffea0);
  Parser::match(this_01,(int)((ulong)this_00 >> 0x20));
  while ((iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), iVar1 == 0x14 ||
         (in_stack_fffffffffffffed0 = (**(code **)(*in_RDI + 0x20))(in_RDI,1),
         in_stack_fffffffffffffed0 == 0x15))) {
    iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    if (iVar2 != 0x14) {
      if (iVar2 != 0x15) {
        local_a9 = 1;
        uVar3 = __cxa_allocate_exception(0x40);
        (**(code **)(*in_RDI + 0x28))(local_a8,in_RDI,1);
        NoViableAltException::NoViableAltException
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        local_a9 = 0;
        __cxa_throw(uVar3,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
      in_stack_fffffffffffffec0 = (RefCount<AST> *)(in_RDI + 6);
      (**(code **)(*in_RDI + 0x28))(local_a0,in_RDI,1);
      ASTFactory::create(this_00,(RefToken *)CONCAT44(iVar1,in_stack_fffffffffffffed0));
      RefCount<AST>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      RefCount<AST>::~RefCount(in_stack_fffffffffffffea0);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffeb0);
      Parser::match(this_01,(int)((ulong)this_00 >> 0x20));
      RefCount<AST>::~RefCount(in_stack_fffffffffffffea0);
    }
    RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffeb0 = (ASTPair *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_c8,in_RDI,1);
    ASTFactory::create(this_00,(RefToken *)CONCAT44(iVar1,in_stack_fffffffffffffed0));
    RefCount<AST>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    RefCount<AST>::~RefCount(in_stack_fffffffffffffea0);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffea8 = (RefCount<AST> *)(in_RDI + 6);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
    ASTFactory::addASTChild(this_02,pAVar4,(RefAST *)this_01);
    RefCount<AST>::~RefCount(in_stack_fffffffffffffea0);
    Parser::match(this_01,(int)((ulong)this_00 >> 0x20));
    RefCount<AST>::~RefCount(in_stack_fffffffffffffea0);
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  pAVar4 = (ASTPair *)(in_RDI + 6);
  (**(code **)(*in_RDI + 0x28))(&stack0xffffffffffffff18,in_RDI,1);
  ASTFactory::create(this_00,(RefToken *)CONCAT44(iVar1,in_stack_fffffffffffffed0));
  iVar1 = (int)((ulong)this_00 >> 0x20);
  RefCount<AST>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  RefCount<AST>::~RefCount(&pAVar4->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffeb0);
  Parser::match(this_01,iVar1);
  RefCount<AST>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  RefCount<AST>::~RefCount(&pAVar4->root);
  RefCount<AST>::~RefCount(&pAVar4->root);
  RefCount<AST>::~RefCount(&pAVar4->root);
  RefCount<AST>::~RefCount(&pAVar4->root);
  RefCount<AST>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  RefCount<AST>::~RefCount(&pAVar4->root);
  ASTPair::~ASTPair(pAVar4);
  return;
}

Assistant:

void GrpParser::postscriptFunc() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST postscriptFunc_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp119_AST = nullAST;
		tmp119_AST = astFactory.create(LT(1));
		astFactory.makeASTRoot(currentAST, tmp119_AST);
		match(LITERAL_postscript);
		RefAST tmp120_AST = nullAST;
		tmp120_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp121_AST = nullAST;
		tmp121_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp121_AST);
		match(LIT_STRING);
		{
		do {
			if ((LA(1)==LIT_STRING||LA(1)==OP_COMMA)) {
				{
				switch ( LA(1)) {
				case OP_COMMA:
				{
					RefAST tmp122_AST = nullAST;
					tmp122_AST = astFactory.create(LT(1));
					match(OP_COMMA);
					break;
				}
				case LIT_STRING:
				{
					break;
				}
				default:
				{
					throw NoViableAltException(LT(1));
				}
				}
				}
				RefAST tmp123_AST = nullAST;
				tmp123_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp123_AST);
				match(LIT_STRING);
			}
			else {
				goto _loop111;
			}
			
		} while (true);
		_loop111:;
		}
		RefAST tmp124_AST = nullAST;
		tmp124_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		postscriptFunc_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_35);
	}
	returnAST = postscriptFunc_AST;
}